

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteRedundantCasts.cpp
# Opt level: O2

Expr * __thiscall RedundantCastsVisitor::simplify(RedundantCastsVisitor *this,Expr *expr)

{
  Expr *Val;
  ret_type pCVar1;
  Expr **ppEVar2;
  Expr **ppEVar3;
  
  pCVar1 = llvm::dyn_cast_or_null<CastExpr,Expr>(expr);
  if (pCVar1 != (ret_type)0x0) {
    ppEVar3 = &(pCVar1->super_UnaryExpr).expr;
    ppEVar2 = ppEVar3;
    do {
      Val = *ppEVar2;
      pCVar1 = llvm::dyn_cast_or_null<CastExpr,Expr>(Val);
      ppEVar2 = &(pCVar1->super_UnaryExpr).expr;
    } while (pCVar1 != (ret_type)0x0);
    *ppEVar3 = Val;
  }
  return expr;
}

Assistant:

Expr* RedundantCastsVisitor::simplify(Expr* expr) {
    if (auto* cast = llvm::dyn_cast_or_null<CastExpr>(expr)) {
        Expr* innermost = cast->expr;

        while (auto* inner = llvm::dyn_cast_or_null<CastExpr>(innermost)) {
            innermost = inner->expr;
        }

        cast->expr = innermost;
    }

    return expr;
}